

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void create(MATRIX *matrix,bool is_random)

{
  int iVar1;
  time_t tVar2;
  int j;
  long lVar3;
  int iVar4;
  allocator_type local_4d;
  value_type local_4c;
  vector<int,_std::allocator<int>_> fil;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (iVar4 = 0; iVar4 != 9; iVar4 = iVar4 + 1) {
    local_4c = 0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &fil.super__Vector_base<int,_std::allocator<int>_>,9,&local_4c,&local_4d);
    if (is_random) {
      for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
        iVar1 = rand();
        fil.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar3] = iVar1 % 9 + 1;
      }
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(matrix,(value_type *)&fil.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&fil.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void create(MATRIX &matrix, bool is_random){
    srand(time(nullptr));
    int filas=9, columnas =9;
    for(int i=0;i<filas;i++){
        vector<int> fil = vector<int>(columnas,0);
        if (is_random == true){
            for(int j=0;j<columnas; j++){
                fil[j] = 1+rand()%9;
            }
        }
        matrix.push_back(fil);
    }
}